

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O2

void __thiscall
slang::ast::CaseAssertionExpr::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
          (CaseAssertionExpr *this,SequenceMethodExprVisitor *visitor)

{
  pointer ppEVar1;
  size_type sVar2;
  AssertionExpr *this_00;
  pointer pIVar3;
  long lVar4;
  ItemGroup *item;
  pointer pIVar5;
  
  Expression::visit<slang::ast::builtins::SequenceMethodExprVisitor&>(this->expr,visitor);
  pIVar5 = (this->items).data_;
  pIVar3 = pIVar5 + (this->items).size_;
  for (; pIVar5 != pIVar3; pIVar5 = pIVar5 + 1) {
    ppEVar1 = (pIVar5->expressions).data_;
    sVar2 = (pIVar5->expressions).size_;
    for (lVar4 = 0; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
      Expression::visit<slang::ast::builtins::SequenceMethodExprVisitor&>
                (*(Expression **)((long)ppEVar1 + lVar4),visitor);
    }
    this_00 = not_null<const_slang::ast::AssertionExpr_*>::get(&pIVar5->body);
    AssertionExpr::visit<slang::ast::builtins::SequenceMethodExprVisitor>(this_00,visitor);
  }
  if (this->defaultCase != (AssertionExpr *)0x0) {
    AssertionExpr::visit<slang::ast::builtins::SequenceMethodExprVisitor>(this->defaultCase,visitor)
    ;
    return;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto& item : items) {
            for (auto e : item.expressions)
                e->visit(visitor);
            item.body->visit(visitor);
        }

        if (defaultCase)
            defaultCase->visit(visitor);
    }